

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O3

DdManager * Llb4_Nonlin4SweepBadStates(Aig_Man_t *pAig,Vec_Int_t *vOrder,int nVars)

{
  Vec_Int_t *vVars2Q;
  DdManager *dd;
  Vec_Ptr_t *vParts;
  DdNode *n;
  DdNode *n_00;
  
  vVars2Q = Llb_Nonlin4SweepVars2Q(pAig,vOrder,0);
  dd = Cudd_Init(nVars,0,0x100,0x40000,0);
  vParts = Llb_Nonlin4SweepPartitions(dd,pAig,vOrder,0);
  n = Llb4_Nonlin4SweepBadMonitor(pAig,vOrder,dd);
  Cudd_Ref(n);
  Cudd_AutodynEnable(dd,CUDD_REORDER_SYMM_SIFT);
  n_00 = Llb_Nonlin4Image(dd,vParts,n,vVars2Q);
  Cudd_Ref(n_00);
  Cudd_RecursiveDeref(dd,n);
  Llb_Nonlin4SweepDeref(dd,vParts);
  if (vVars2Q->pArray != (int *)0x0) {
    free(vVars2Q->pArray);
  }
  free(vVars2Q);
  dd->bFunc = n_00;
  return dd;
}

Assistant:

DdManager * Llb4_Nonlin4SweepBadStates( Aig_Man_t * pAig, Vec_Int_t * vOrder, int nVars )
{
    DdManager * dd;
    Vec_Ptr_t * vParts;
    Vec_Int_t * vVars2Q;
    DdNode * bMonitor, * bImage;
    // get quantifiable variables
    vVars2Q = Llb_Nonlin4SweepVars2Q( pAig, vOrder, 0 );
    // start BDD manager and create partitions 
    dd = Cudd_Init( nVars, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    vParts = Llb_Nonlin4SweepPartitions( dd, pAig, vOrder, 0 );
//printf( "Outputs: " );
//Llb_Nonlin4SweepPrint( vParts );
    // compute image of the partitions
    bMonitor = Llb4_Nonlin4SweepBadMonitor( pAig, vOrder, dd );  Cudd_Ref( bMonitor );
    Cudd_AutodynEnable( dd,  CUDD_REORDER_SYMM_SIFT );
    bImage = Llb_Nonlin4Image( dd, vParts, bMonitor, vVars2Q );  Cudd_Ref( bImage );
    Cudd_RecursiveDeref( dd, bMonitor );
    Llb_Nonlin4SweepDeref( dd, vParts );
    Vec_IntFree( vVars2Q );
    // save image and return
    dd->bFunc = bImage;
    return dd;
}